

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LWSLoader.cpp
# Opt level: O0

void __thiscall
Assimp::LWSImporter::InternReadFile
          (LWSImporter *this,string *pFile,aiScene *pScene,IOSystem *pIOHandler)

{
  size_t *this_00;
  bool bVar1;
  PrePostBehaviour PVar2;
  uint uVar3;
  IOStream *__p;
  pointer pIVar4;
  DeadlyImportError *pDVar5;
  reference pEVar6;
  char *pcVar7;
  Logger *pLVar8;
  reference fill;
  reference pEVar9;
  reference pvVar10;
  reference pNVar11;
  aiNode *paVar12;
  void *pvVar13;
  aiCamera *paVar14;
  reference pNVar15;
  size_type sVar16;
  aiAnimation *this_01;
  aiNodeAnim **ppaVar17;
  iterator __first;
  iterator __last;
  ai_real aVar18;
  undefined1 local_8f0 [8];
  SkeletonMeshBuilder builder;
  FlipWindingOrderProcess flipper;
  MakeLeftHandedProcess monster_cheat;
  aiAnimation *anim;
  aiNode *ro;
  _Self local_848;
  iterator it_4;
  vector<aiNodeAnim_*,_std::allocator<aiNodeAnim_*>_> anims;
  vector<Assimp::AttachmentInfo,_std::allocator<Assimp::AttachmentInfo>_> attach;
  aiLight **lights;
  aiCamera **cams;
  aiNode *nd;
  aiScene *master;
  string local_7e8;
  _Self local_7c8;
  _Self local_7c0;
  iterator it_3;
  reference pNStack_7b0;
  uint no_parent;
  _Self local_7a8;
  _Self local_7a0;
  iterator dit;
  _Self local_790;
  iterator it_2;
  NodeDesc d_5;
  NodeDesc d_4;
  Envelope *env_1;
  _Self local_628;
  iterator it_1;
  _List_const_iterator<Assimp::LWS::Element> local_618;
  reference local_610;
  Envelope *env;
  undefined1 local_5d0 [8];
  NodeDesc d_3;
  NodeDesc d_2;
  string local_478;
  undefined1 local_458 [8];
  string path_1;
  NodeDesc d_1;
  string local_388;
  undefined1 local_368 [8];
  string path;
  NodeDesc d;
  PropertyMap props;
  char *pcStack_1d8;
  int layer;
  char *c;
  _List_const_iterator<Assimp::LWS::Element> local_1c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c0;
  uint local_1a0;
  undefined1 local_19a;
  allocator<char> local_199;
  uint version;
  iterator local_178;
  _List_const_iterator<Assimp::LWS::Element> local_170;
  const_iterator it;
  uint uStack_15c;
  bool motion_file;
  uint num_object;
  uint num_camera;
  uint num_light;
  uint cur_object;
  uint cur_camera;
  uint cur_light;
  list<Assimp::LWS::NodeDesc,_std::allocator<Assimp::LWS::NodeDesc>_> nodes;
  BatchLoader batch;
  char *dummy;
  Element root;
  vector<char,_std::allocator<char>_> mBuffer;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  allocator<char> local_51;
  string local_50;
  unique_ptr<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_> local_30;
  unique_ptr<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_> file;
  IOSystem *pIOHandler_local;
  aiScene *pScene_local;
  string *pFile_local;
  LWSImporter *this_local;
  
  this->io = pIOHandler;
  file._M_t.super___uniq_ptr_impl<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_>._M_t.
  super__Tuple_impl<0UL,_Assimp::IOStream_*,_std::default_delete<Assimp::IOStream>_>.
  super__Head_base<0UL,_Assimp::IOStream_*,_false>._M_head_impl =
       (__uniq_ptr_data<Assimp::IOStream,_std::default_delete<Assimp::IOStream>,_true,_true>)
       (__uniq_ptr_data<Assimp::IOStream,_std::default_delete<Assimp::IOStream>,_true,_true>)
       pIOHandler;
  pIOHandler_local = (IOSystem *)pScene;
  pScene_local = (aiScene *)pFile;
  pFile_local = (string *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"rb",&local_51);
  __p = IOSystem::Open(pIOHandler,pFile,&local_50);
  std::unique_ptr<Assimp::IOStream,std::default_delete<Assimp::IOStream>>::
  unique_ptr<std::default_delete<Assimp::IOStream>,void>
            ((unique_ptr<Assimp::IOStream,std::default_delete<Assimp::IOStream>> *)&local_30,__p);
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator(&local_51);
  pIVar4 = std::unique_ptr<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_>::get(&local_30)
  ;
  if (pIVar4 == (pointer)0x0) {
    pDVar5 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
    std::operator+(&local_a8,"Failed to open LWS file ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pScene_local
                  );
    std::operator+(&local_88,&local_a8,".");
    DeadlyImportError::DeadlyImportError(pDVar5,&local_88);
    __cxa_throw(pDVar5,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
  }
  this_00 = &root.children.
             super__List_base<Assimp::LWS::Element,_std::allocator<Assimp::LWS::Element>_>._M_impl.
             _M_node._M_size;
  std::vector<char,_std::allocator<char>_>::vector((vector<char,_std::allocator<char>_> *)this_00);
  pIVar4 = std::unique_ptr<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_>::get(&local_30)
  ;
  BaseImporter::TextFileToBuffer(pIVar4,(vector<char,_std::allocator<char>_> *)this_00,FORBID_EMPTY)
  ;
  LWS::Element::Element((Element *)&dummy);
  batch.m_data = (BatchData *)
                 std::vector<char,_std::allocator<char>_>::operator[]
                           ((vector<char,_std::allocator<char>_> *)
                            &root.children.
                             super__List_base<Assimp::LWS::Element,_std::allocator<Assimp::LWS::Element>_>
                             ._M_impl._M_node._M_size,0);
  LWS::Element::Parse((Element *)&dummy,(char **)&batch);
  BatchLoader::BatchLoader
            ((BatchLoader *)
             &nodes.super__List_base<Assimp::LWS::NodeDesc,_std::allocator<Assimp::LWS::NodeDesc>_>.
              _M_impl._M_node._M_size,
             (IOSystem *)
             file._M_t.
             super___uniq_ptr_impl<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_>._M_t.
             super__Tuple_impl<0UL,_Assimp::IOStream_*,_std::default_delete<Assimp::IOStream>_>.
             super__Head_base<0UL,_Assimp::IOStream_*,_false>._M_head_impl,false);
  std::__cxx11::list<Assimp::LWS::NodeDesc,_std::allocator<Assimp::LWS::NodeDesc>_>::list
            ((list<Assimp::LWS::NodeDesc,_std::allocator<Assimp::LWS::NodeDesc>_> *)&cur_camera);
  cur_object = 0;
  num_camera = 0;
  num_object = 0;
  uStack_15c = 0;
  it._M_node._7_1_ = 0;
  local_178._M_node =
       (_List_node_base *)
       std::__cxx11::list<Assimp::LWS::Element,_std::allocator<Assimp::LWS::Element>_>::begin
                 ((list<Assimp::LWS::Element,_std::allocator<Assimp::LWS::Element>_> *)
                  ((long)&root.tokens[1].field_2 + 8));
  std::_List_const_iterator<Assimp::LWS::Element>::_List_const_iterator(&local_170,&local_178);
  pEVar6 = std::_List_const_iterator<Assimp::LWS::Element>::operator*(&local_170);
  bVar1 = std::operator==(pEVar6->tokens,"LWMO");
  if (bVar1) {
    it._M_node._7_1_ = 1;
  }
  pEVar6 = std::_List_const_iterator<Assimp::LWS::Element>::operator*(&local_170);
  bVar1 = std::operator!=(pEVar6->tokens,"LWSC");
  if ((bVar1) && ((it._M_node._7_1_ & 1) == 0)) {
    local_19a = 1;
    pDVar5 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&version,"LWS: Not a LightWave scene, magic tag LWSC not found",&local_199)
    ;
    DeadlyImportError::DeadlyImportError(pDVar5,(string *)&version);
    local_19a = 0;
    __cxa_throw(pDVar5,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
  }
  std::_List_const_iterator<Assimp::LWS::Element>::operator++(&local_170);
  std::_List_const_iterator<Assimp::LWS::Element>::operator*(&local_170);
  pcVar7 = (char *)std::__cxx11::string::c_str();
  local_1a0 = strtoul10(pcVar7,(char **)0x0);
  pLVar8 = DefaultLogger::get();
  pEVar6 = std::_List_const_iterator<Assimp::LWS::Element>::operator*(&local_170);
  std::operator+(&local_1c0,"LWS file format version is ",pEVar6->tokens);
  Logger::info(pLVar8,&local_1c0);
  std::__cxx11::string::~string((string *)&local_1c0);
  this->first = 0.0;
  this->last = 60.0;
  this->fps = 25.0;
  do {
    c = (char *)std::__cxx11::list<Assimp::LWS::Element,_std::allocator<Assimp::LWS::Element>_>::end
                          ((list<Assimp::LWS::Element,_std::allocator<Assimp::LWS::Element>_> *)
                           ((long)&root.tokens[1].field_2 + 8));
    std::_List_const_iterator<Assimp::LWS::Element>::_List_const_iterator(&local_1c8,(iterator *)&c)
    ;
    bVar1 = std::operator!=(&local_170,&local_1c8);
    if (!bVar1) {
      local_790._M_node =
           (_List_node_base *)
           std::__cxx11::list<Assimp::LWS::NodeDesc,_std::allocator<Assimp::LWS::NodeDesc>_>::begin
                     ((list<Assimp::LWS::NodeDesc,_std::allocator<Assimp::LWS::NodeDesc>_> *)
                      &cur_camera);
      while( true ) {
        dit = std::__cxx11::list<Assimp::LWS::NodeDesc,_std::allocator<Assimp::LWS::NodeDesc>_>::end
                        ((list<Assimp::LWS::NodeDesc,_std::allocator<Assimp::LWS::NodeDesc>_> *)
                         &cur_camera);
        bVar1 = std::operator!=(&local_790,&dit);
        if (!bVar1) break;
        local_7a0._M_node =
             (_List_node_base *)
             std::__cxx11::list<Assimp::LWS::NodeDesc,_std::allocator<Assimp::LWS::NodeDesc>_>::
             begin((list<Assimp::LWS::NodeDesc,_std::allocator<Assimp::LWS::NodeDesc>_> *)
                   &cur_camera);
        while( true ) {
          local_7a8._M_node =
               (_List_node_base *)
               std::__cxx11::list<Assimp::LWS::NodeDesc,_std::allocator<Assimp::LWS::NodeDesc>_>::
               end((list<Assimp::LWS::NodeDesc,_std::allocator<Assimp::LWS::NodeDesc>_> *)
                   &cur_camera);
          bVar1 = std::operator!=(&local_7a0,&local_7a8);
          if (!bVar1) break;
          bVar1 = std::operator!=(&local_7a0,&local_790);
          if (bVar1) {
            pNVar15 = std::_List_iterator<Assimp::LWS::NodeDesc>::operator*(&local_790);
            pNVar11 = std::_List_iterator<Assimp::LWS::NodeDesc>::operator*(&local_7a0);
            bVar1 = LWS::NodeDesc::operator==(pNVar15,pNVar11->parent);
            if (bVar1) {
              pNVar15 = std::_List_iterator<Assimp::LWS::NodeDesc>::operator*(&local_7a0);
              if (pNVar15->parent_resolved == (NodeDesc *)0x0) {
                pNVar15 = std::_List_iterator<Assimp::LWS::NodeDesc>::operator*(&local_790);
                pNStack_7b0 = std::_List_iterator<Assimp::LWS::NodeDesc>::operator*(&local_7a0);
                std::__cxx11::
                list<Assimp::LWS::NodeDesc_*,_std::allocator<Assimp::LWS::NodeDesc_*>_>::push_back
                          (&pNVar15->children,&stack0xfffffffffffff850);
                pNVar15 = std::_List_iterator<Assimp::LWS::NodeDesc>::operator*(&local_790);
                pNVar11 = std::_List_iterator<Assimp::LWS::NodeDesc>::operator*(&local_7a0);
                pNVar11->parent_resolved = pNVar15;
              }
              else {
                pLVar8 = DefaultLogger::get();
                Logger::error(pLVar8,"LWS: Found cross reference in scene-graph");
              }
            }
          }
          std::_List_iterator<Assimp::LWS::NodeDesc>::operator++(&local_7a0);
        }
        std::_List_iterator<Assimp::LWS::NodeDesc>::operator++(&local_790);
      }
      it_3._M_node._4_4_ = 0;
      local_7c0._M_node =
           (_List_node_base *)
           std::__cxx11::list<Assimp::LWS::NodeDesc,_std::allocator<Assimp::LWS::NodeDesc>_>::begin
                     ((list<Assimp::LWS::NodeDesc,_std::allocator<Assimp::LWS::NodeDesc>_> *)
                      &cur_camera);
      while( true ) {
        local_7c8._M_node =
             (_List_node_base *)
             std::__cxx11::list<Assimp::LWS::NodeDesc,_std::allocator<Assimp::LWS::NodeDesc>_>::end
                       ((list<Assimp::LWS::NodeDesc,_std::allocator<Assimp::LWS::NodeDesc>_> *)
                        &cur_camera);
        bVar1 = std::operator!=(&local_7c0,&local_7c8);
        if (!bVar1) break;
        pNVar15 = std::_List_iterator<Assimp::LWS::NodeDesc>::operator*(&local_7c0);
        if (pNVar15->parent_resolved == (NodeDesc *)0x0) {
          it_3._M_node._4_4_ = it_3._M_node._4_4_ + 1;
        }
        std::_List_iterator<Assimp::LWS::NodeDesc>::operator++(&local_7c0);
      }
      if (it_3._M_node._4_4_ != 0) {
        BatchLoader::LoadAll
                  ((BatchLoader *)
                   &nodes.
                    super__List_base<Assimp::LWS::NodeDesc,_std::allocator<Assimp::LWS::NodeDesc>_>.
                    _M_impl._M_node._M_size);
        paVar12 = (aiNode *)operator_new(0x80);
        aiScene::aiScene((aiScene *)paVar12);
        nd = paVar12;
        paVar12 = (aiNode *)operator_new(0x478);
        aiNode::aiNode(paVar12);
        *(aiNode **)((nd->mName).data + 4) = paVar12;
        cams = (aiCamera **)paVar12;
        if (uStack_15c != 0) {
          *(uint *)((nd->mName).data + 0x5c) = uStack_15c;
          pvVar13 = operator_new__((ulong)uStack_15c << 3);
          *(void **)((nd->mName).data + 100) = pvVar13;
        }
        lights = *(aiLight ***)((nd->mName).data + 100);
        if (num_object != 0) {
          *(uint *)((nd->mName).data + 0x4c) = num_object;
          pvVar13 = operator_new__((ulong)num_object << 3);
          *(void **)((nd->mName).data + 0x54) = pvVar13;
        }
        attach.super__Vector_base<Assimp::AttachmentInfo,_std::allocator<Assimp::AttachmentInfo>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = *(pointer *)((nd->mName).data + 0x54);
        std::vector<Assimp::AttachmentInfo,_std::allocator<Assimp::AttachmentInfo>_>::vector
                  ((vector<Assimp::AttachmentInfo,_std::allocator<Assimp::AttachmentInfo>_> *)
                   &anims.super__Vector_base<aiNodeAnim_*,_std::allocator<aiNodeAnim_*>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage);
        std::vector<aiNodeAnim_*,_std::allocator<aiNodeAnim_*>_>::vector
                  ((vector<aiNodeAnim_*,_std::allocator<aiNodeAnim_*>_> *)&it_4);
        aiString::Set((aiString *)cams,"<LWSRoot>");
        paVar14 = (aiCamera *)operator_new__((ulong)it_3._M_node._4_4_ << 3);
        cams[0x8b] = paVar14;
        local_848._M_node =
             (_List_node_base *)
             std::__cxx11::list<Assimp::LWS::NodeDesc,_std::allocator<Assimp::LWS::NodeDesc>_>::
             begin((list<Assimp::LWS::NodeDesc,_std::allocator<Assimp::LWS::NodeDesc>_> *)
                   &cur_camera);
        while( true ) {
          ro = (aiNode *)
               std::__cxx11::list<Assimp::LWS::NodeDesc,_std::allocator<Assimp::LWS::NodeDesc>_>::
               end((list<Assimp::LWS::NodeDesc,_std::allocator<Assimp::LWS::NodeDesc>_> *)
                   &cur_camera);
          bVar1 = std::operator!=(&local_848,(_Self *)&ro);
          if (!bVar1) break;
          pNVar15 = std::_List_iterator<Assimp::LWS::NodeDesc>::operator*(&local_848);
          if (pNVar15->parent_resolved == (NodeDesc *)0x0) {
            paVar12 = (aiNode *)operator_new(0x478);
            aiNode::aiNode(paVar12);
            uVar3 = *(uint *)(cams + 0x8a);
            *(uint *)(cams + 0x8a) = uVar3 + 1;
            *(aiNode **)((cams[0x8b]->mName).data + (ulong)uVar3 * 8 + -4) = paVar12;
            paVar12->mParent = (aiNode *)cams;
            pNVar15 = std::_List_iterator<Assimp::LWS::NodeDesc>::operator*(&local_848);
            BuildGraph(this,paVar12,pNVar15,
                       (vector<Assimp::AttachmentInfo,_std::allocator<Assimp::AttachmentInfo>_> *)
                       &anims.super__Vector_base<aiNodeAnim_*,_std::allocator<aiNodeAnim_*>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage,
                       (BatchLoader *)
                       &nodes.
                        super__List_base<Assimp::LWS::NodeDesc,_std::allocator<Assimp::LWS::NodeDesc>_>
                        ._M_impl._M_node._M_size,(aiCamera ***)&lights,
                       (aiLight ***)
                       &attach.
                        super__Vector_base<Assimp::AttachmentInfo,_std::allocator<Assimp::AttachmentInfo>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,
                       (vector<aiNodeAnim_*,_std::allocator<aiNodeAnim_*>_> *)&it_4);
          }
          std::_List_iterator<Assimp::LWS::NodeDesc>::operator++(&local_848);
        }
        sVar16 = std::vector<aiNodeAnim_*,_std::allocator<aiNodeAnim_*>_>::size
                           ((vector<aiNodeAnim_*,_std::allocator<aiNodeAnim_*>_> *)&it_4);
        if (sVar16 != 0) {
          (nd->mName).data[0x2c] = '\x01';
          (nd->mName).data[0x2d] = '\0';
          (nd->mName).data[0x2e] = '\0';
          (nd->mName).data[0x2f] = '\0';
          pvVar13 = operator_new__(8);
          *(void **)((nd->mName).data + 0x34) = pvVar13;
          this_01 = (aiAnimation *)operator_new(0x448);
          aiAnimation::aiAnimation(this_01);
          **(undefined8 **)((nd->mName).data + 0x34) = this_01;
          aiString::Set((aiString *)this_01,"LWSMasterAnim");
          this_01->mTicksPerSecond = this->fps;
          this_01->mDuration = this->last - (this->first + -1.0);
          sVar16 = std::vector<aiNodeAnim_*,_std::allocator<aiNodeAnim_*>_>::size
                             ((vector<aiNodeAnim_*,_std::allocator<aiNodeAnim_*>_> *)&it_4);
          this_01->mNumChannels = (uint)sVar16;
          ppaVar17 = (aiNodeAnim **)operator_new__((sVar16 & 0xffffffff) << 3);
          this_01->mChannels = ppaVar17;
          __first = std::vector<aiNodeAnim_*,_std::allocator<aiNodeAnim_*>_>::begin
                              ((vector<aiNodeAnim_*,_std::allocator<aiNodeAnim_*>_> *)&it_4);
          __last = std::vector<aiNodeAnim_*,_std::allocator<aiNodeAnim_*>_>::end
                             ((vector<aiNodeAnim_*,_std::allocator<aiNodeAnim_*>_> *)&it_4);
          std::
          copy<__gnu_cxx::__normal_iterator<aiNodeAnim**,std::vector<aiNodeAnim*,std::allocator<aiNodeAnim*>>>,aiNodeAnim**>
                    ((__normal_iterator<aiNodeAnim_**,_std::vector<aiNodeAnim_*,_std::allocator<aiNodeAnim_*>_>_>
                      )__first._M_current,
                     (__normal_iterator<aiNodeAnim_**,_std::vector<aiNodeAnim_*,_std::allocator<aiNodeAnim_*>_>_>
                      )__last._M_current,this_01->mChannels);
        }
        MakeLeftHandedProcess::MakeLeftHandedProcess
                  ((MakeLeftHandedProcess *)&flipper.super_BaseProcess.progress);
        MakeLeftHandedProcess::Execute
                  ((MakeLeftHandedProcess *)&flipper.super_BaseProcess.progress,(aiScene *)nd);
        FlipWindingOrderProcess::FlipWindingOrderProcess
                  ((FlipWindingOrderProcess *)&builder.mKnobsOnly);
        FlipWindingOrderProcess::Execute
                  ((FlipWindingOrderProcess *)&builder.mKnobsOnly,(aiScene *)nd);
        uVar3 = 0x13;
        if ((this->configSpeedFlag & 1U) != 0) {
          uVar3 = 1;
        }
        SceneCombiner::MergeScenes
                  ((aiScene **)&pIOHandler_local,(aiScene *)nd,
                   (vector<Assimp::AttachmentInfo,_std::allocator<Assimp::AttachmentInfo>_> *)
                   &anims.super__Vector_base<aiNodeAnim_*,_std::allocator<aiNodeAnim_*>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage,uVar3);
        if ((((*(int *)&(pIOHandler_local->m_pathStack).
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish == 0) ||
             (*(int *)&pIOHandler_local[1]._vptr_IOSystem == 0)) &&
            (*(uint *)&pIOHandler_local->_vptr_IOSystem =
                  *(uint *)&pIOHandler_local->_vptr_IOSystem | 1,
            *(int *)&pIOHandler_local[1].m_pathStack.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish != 0)) &&
           ((this->noSkeletonMesh & 1U) == 0)) {
          SkeletonMeshBuilder::SkeletonMeshBuilder
                    ((SkeletonMeshBuilder *)local_8f0,(aiScene *)pIOHandler_local,(aiNode *)0x0,
                     false);
          SkeletonMeshBuilder::~SkeletonMeshBuilder((SkeletonMeshBuilder *)local_8f0);
        }
        FlipWindingOrderProcess::~FlipWindingOrderProcess
                  ((FlipWindingOrderProcess *)&builder.mKnobsOnly);
        MakeLeftHandedProcess::~MakeLeftHandedProcess
                  ((MakeLeftHandedProcess *)&flipper.super_BaseProcess.progress);
        std::vector<aiNodeAnim_*,_std::allocator<aiNodeAnim_*>_>::~vector
                  ((vector<aiNodeAnim_*,_std::allocator<aiNodeAnim_*>_> *)&it_4);
        std::vector<Assimp::AttachmentInfo,_std::allocator<Assimp::AttachmentInfo>_>::~vector
                  ((vector<Assimp::AttachmentInfo,_std::allocator<Assimp::AttachmentInfo>_> *)
                   &anims.super__Vector_base<aiNodeAnim_*,_std::allocator<aiNodeAnim_*>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage);
        std::__cxx11::list<Assimp::LWS::NodeDesc,_std::allocator<Assimp::LWS::NodeDesc>_>::~list
                  ((list<Assimp::LWS::NodeDesc,_std::allocator<Assimp::LWS::NodeDesc>_> *)
                   &cur_camera);
        BatchLoader::~BatchLoader
                  ((BatchLoader *)
                   &nodes.
                    super__List_base<Assimp::LWS::NodeDesc,_std::allocator<Assimp::LWS::NodeDesc>_>.
                    _M_impl._M_node._M_size);
        LWS::Element::~Element((Element *)&dummy);
        std::vector<char,_std::allocator<char>_>::~vector
                  ((vector<char,_std::allocator<char>_> *)
                   &root.children.
                    super__List_base<Assimp::LWS::Element,_std::allocator<Assimp::LWS::Element>_>.
                    _M_impl._M_node._M_size);
        std::unique_ptr<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_>::~unique_ptr
                  (&local_30);
        return;
      }
      master._6_1_ = 1;
      pDVar5 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_7e8,"LWS: Unable to find scene root node",
                 (allocator<char> *)((long)&master + 7));
      DeadlyImportError::DeadlyImportError(pDVar5,&local_7e8);
      master._6_1_ = 0;
      __cxa_throw(pDVar5,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
    }
    std::_List_const_iterator<Assimp::LWS::Element>::operator*(&local_170);
    pcStack_1d8 = (char *)std::__cxx11::string::c_str();
    pEVar6 = std::_List_const_iterator<Assimp::LWS::Element>::operator*(&local_170);
    bVar1 = std::operator==(pEVar6->tokens,"FirstFrame");
    if (bVar1) {
      if ((this->first != 150392.0) || (NAN(this->first))) {
        uVar3 = strtoul10(pcStack_1d8,&stack0xfffffffffffffe28);
        this->first = (double)uVar3 - 1.0;
      }
    }
    else {
      pEVar6 = std::_List_const_iterator<Assimp::LWS::Element>::operator*(&local_170);
      bVar1 = std::operator==(pEVar6->tokens,"LastFrame");
      if (bVar1) {
        if ((this->last != 150392.0) || (NAN(this->last))) {
          uVar3 = strtoul10(pcStack_1d8,&stack0xfffffffffffffe28);
          this->last = (double)uVar3 - 1.0;
        }
      }
      else {
        pEVar6 = std::_List_const_iterator<Assimp::LWS::Element>::operator*(&local_170);
        bVar1 = std::operator==(pEVar6->tokens,"FramesPerSecond");
        if (bVar1) {
          uVar3 = strtoul10(pcStack_1d8,&stack0xfffffffffffffe28);
          this->fps = (double)uVar3;
        }
        else {
          pEVar6 = std::_List_const_iterator<Assimp::LWS::Element>::operator*(&local_170);
          bVar1 = std::operator==(pEVar6->tokens,"LoadObjectLayer");
          if (bVar1) {
            props.matrices._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ =
                 strtoul10(pcStack_1d8,&stack0xfffffffffffffe28);
            BatchLoader::PropertyMap::PropertyMap((PropertyMap *)&d.parent_resolved);
            SetGenericProperty<int>
                      ((map<unsigned_int,_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>_>
                        *)&d.parent_resolved,"IMPORT_LWO_ONE_LAYER_ONLY",
                       (int *)((long)&props.matrices._M_t._M_impl.super__Rb_tree_header.
                                      _M_node_count + 4));
            LWS::NodeDesc::NodeDesc((NodeDesc *)((long)&path.field_2 + 8));
            path.field_2._8_4_ = 1;
            if (local_1a0 < 4) {
              d.path.field_2._12_4_ = num_camera;
              num_camera = num_camera + 1;
            }
            else {
              SkipSpaces<char>(&stack0xfffffffffffffe28);
              uVar3 = strtoul16(pcStack_1d8,&stack0xfffffffffffffe28);
              d.path.field_2._12_4_ = uVar3 & 0xfffffff;
            }
            SkipSpaces<char>(&stack0xfffffffffffffe28);
            pcVar7 = pcStack_1d8;
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_388,pcVar7,
                       (allocator<char> *)((long)&d_1.parent_resolved + 7));
            FindLWOFile((string *)local_368,this,&local_388);
            std::__cxx11::string::~string((string *)&local_388);
            std::allocator<char>::~allocator((allocator<char> *)((long)&d_1.parent_resolved + 7));
            std::__cxx11::string::operator=((string *)&d,(string *)local_368);
            d.path.field_2._8_4_ =
                 BatchLoader::AddLoadRequest
                           ((BatchLoader *)
                            &nodes.
                             super__List_base<Assimp::LWS::NodeDesc,_std::allocator<Assimp::LWS::NodeDesc>_>
                             ._M_impl._M_node._M_size,(string *)local_368,0,
                            (PropertyMap *)&d.parent_resolved);
            std::__cxx11::list<Assimp::LWS::NodeDesc,_std::allocator<Assimp::LWS::NodeDesc>_>::
            push_back((list<Assimp::LWS::NodeDesc,_std::allocator<Assimp::LWS::NodeDesc>_> *)
                      &cur_camera,(value_type *)((long)&path.field_2 + 8));
            std::__cxx11::string::~string((string *)local_368);
            LWS::NodeDesc::~NodeDesc((NodeDesc *)((long)&path.field_2 + 8));
            BatchLoader::PropertyMap::~PropertyMap((PropertyMap *)&d.parent_resolved);
          }
          else {
            pEVar6 = std::_List_const_iterator<Assimp::LWS::Element>::operator*(&local_170);
            bVar1 = std::operator==(pEVar6->tokens,"LoadObject");
            if (bVar1) {
              LWS::NodeDesc::NodeDesc((NodeDesc *)((long)&path_1.field_2 + 8));
              path_1.field_2._8_4_ = 1;
              if (local_1a0 < 4) {
                d_1.path.field_2._12_4_ = num_camera;
                num_camera = num_camera + 1;
              }
              else {
                uVar3 = strtoul16(pcStack_1d8,&stack0xfffffffffffffe28);
                d_1.path.field_2._12_4_ = uVar3 & 0xfffffff;
                SkipSpaces<char>(&stack0xfffffffffffffe28);
              }
              pcVar7 = pcStack_1d8;
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_478,pcVar7,
                         (allocator<char> *)((long)&d_2.parent_resolved + 7));
              FindLWOFile((string *)local_458,this,&local_478);
              std::__cxx11::string::~string((string *)&local_478);
              std::allocator<char>::~allocator((allocator<char> *)((long)&d_2.parent_resolved + 7));
              d_1.path.field_2._8_4_ =
                   BatchLoader::AddLoadRequest
                             ((BatchLoader *)
                              &nodes.
                               super__List_base<Assimp::LWS::NodeDesc,_std::allocator<Assimp::LWS::NodeDesc>_>
                               ._M_impl._M_node._M_size,(string *)local_458,0,(PropertyMap *)0x0);
              std::__cxx11::string::operator=((string *)&d_1,(string *)local_458);
              std::__cxx11::list<Assimp::LWS::NodeDesc,_std::allocator<Assimp::LWS::NodeDesc>_>::
              push_back((list<Assimp::LWS::NodeDesc,_std::allocator<Assimp::LWS::NodeDesc>_> *)
                        &cur_camera,(value_type *)((long)&path_1.field_2 + 8));
              std::__cxx11::string::~string((string *)local_458);
              LWS::NodeDesc::~NodeDesc((NodeDesc *)((long)&path_1.field_2 + 8));
            }
            else {
              pEVar6 = std::_List_const_iterator<Assimp::LWS::Element>::operator*(&local_170);
              bVar1 = std::operator==(pEVar6->tokens,"AddNullObject");
              if (bVar1) {
                LWS::NodeDesc::NodeDesc((NodeDesc *)&d_3.parent_resolved);
                d_3.parent_resolved._0_4_ = 1;
                if (local_1a0 < 4) {
                  d_2.path.field_2._12_4_ = num_camera;
                  num_camera = num_camera + 1;
                }
                else {
                  uVar3 = strtoul16(pcStack_1d8,&stack0xfffffffffffffe28);
                  d_2.path.field_2._12_4_ = uVar3 & 0xfffffff;
                  SkipSpaces<char>(&stack0xfffffffffffffe28);
                }
                d_2._48_8_ = pcStack_1d8;
                std::__cxx11::list<Assimp::LWS::NodeDesc,_std::allocator<Assimp::LWS::NodeDesc>_>::
                push_back((list<Assimp::LWS::NodeDesc,_std::allocator<Assimp::LWS::NodeDesc>_> *)
                          &cur_camera,(value_type *)&d_3.parent_resolved);
                LWS::NodeDesc::~NodeDesc((NodeDesc *)&d_3.parent_resolved);
              }
              else {
                pEVar6 = std::_List_const_iterator<Assimp::LWS::Element>::operator*(&local_170);
                bVar1 = std::operator==(pEVar6->tokens,"NumChannels");
                if (!bVar1) {
                  pEVar6 = std::_List_const_iterator<Assimp::LWS::Element>::operator*(&local_170);
                  bVar1 = std::operator==(pEVar6->tokens,"Channel");
                  if (bVar1) {
                    bVar1 = std::__cxx11::
                            list<Assimp::LWS::NodeDesc,_std::allocator<Assimp::LWS::NodeDesc>_>::
                            empty((list<Assimp::LWS::NodeDesc,_std::allocator<Assimp::LWS::NodeDesc>_>
                                   *)&cur_camera);
                    if (bVar1) {
                      if ((it._M_node._7_1_ & 1) != 0) {
                        LWS::NodeDesc::NodeDesc((NodeDesc *)local_5d0);
                        local_5d0._0_4_ = OBJECT;
                        d_3._48_8_ = pcStack_1d8;
                        d_3.path.field_2._12_4_ = num_camera;
                        std::__cxx11::
                        list<Assimp::LWS::NodeDesc,_std::allocator<Assimp::LWS::NodeDesc>_>::
                        push_back((list<Assimp::LWS::NodeDesc,_std::allocator<Assimp::LWS::NodeDesc>_>
                                   *)&cur_camera,(value_type *)local_5d0);
                        LWS::NodeDesc::~NodeDesc((NodeDesc *)local_5d0);
                        num_camera = num_camera + 1;
                      }
                      pLVar8 = DefaultLogger::get();
                      Logger::error(pLVar8,"LWS: Unexpected keyword: \'Channel\'");
                    }
                    pvVar10 = std::__cxx11::
                              list<Assimp::LWS::NodeDesc,_std::allocator<Assimp::LWS::NodeDesc>_>::
                              back((list<Assimp::LWS::NodeDesc,_std::allocator<Assimp::LWS::NodeDesc>_>
                                    *)&cur_camera);
                    LWO::Envelope::Envelope((Envelope *)&env);
                    std::__cxx11::
                    list<Assimp::LWO::Envelope,_std::allocator<Assimp::LWO::Envelope>_>::push_back
                              (&pvVar10->channels,(Envelope *)&env);
                    LWO::Envelope::~Envelope((Envelope *)&env);
                    pvVar10 = std::__cxx11::
                              list<Assimp::LWS::NodeDesc,_std::allocator<Assimp::LWS::NodeDesc>_>::
                              back((list<Assimp::LWS::NodeDesc,_std::allocator<Assimp::LWS::NodeDesc>_>
                                    *)&cur_camera);
                    local_610 = std::__cxx11::
                                list<Assimp::LWO::Envelope,_std::allocator<Assimp::LWO::Envelope>_>
                                ::back(&pvVar10->channels);
                    uVar3 = strtoul10(pcStack_1d8,(char **)0x0);
                    local_610->index = uVar3;
                    local_610->type = local_610->index + EnvelopeType_Position_X;
                  }
                  else {
                    pEVar6 = std::_List_const_iterator<Assimp::LWS::Element>::operator*(&local_170);
                    bVar1 = std::operator==(pEVar6->tokens,"Envelope");
                    if (bVar1) {
                      bVar1 = std::__cxx11::
                              list<Assimp::LWS::NodeDesc,_std::allocator<Assimp::LWS::NodeDesc>_>::
                              empty((list<Assimp::LWS::NodeDesc,_std::allocator<Assimp::LWS::NodeDesc>_>
                                     *)&cur_camera);
                      if (!bVar1) {
                        pvVar10 = std::__cxx11::
                                  list<Assimp::LWS::NodeDesc,_std::allocator<Assimp::LWS::NodeDesc>_>
                                  ::back((list<Assimp::LWS::NodeDesc,_std::allocator<Assimp::LWS::NodeDesc>_>
                                          *)&cur_camera);
                        bVar1 = std::__cxx11::
                                list<Assimp::LWO::Envelope,_std::allocator<Assimp::LWO::Envelope>_>
                                ::empty(&pvVar10->channels);
                        if (!bVar1) {
                          pEVar6 = std::_List_const_iterator<Assimp::LWS::Element>::operator*
                                             (&local_170);
                          pvVar10 = std::__cxx11::
                                    list<Assimp::LWS::NodeDesc,_std::allocator<Assimp::LWS::NodeDesc>_>
                                    ::back((list<Assimp::LWS::NodeDesc,_std::allocator<Assimp::LWS::NodeDesc>_>
                                            *)&cur_camera);
                          fill = std::__cxx11::
                                 list<Assimp::LWO::Envelope,_std::allocator<Assimp::LWO::Envelope>_>
                                 ::back(&pvVar10->channels);
                          ReadEnvelope(this,pEVar6,fill);
                          goto LAB_00683808;
                        }
                      }
                      pLVar8 = DefaultLogger::get();
                      Logger::error(pLVar8,"LWS: Unexpected keyword: \'Envelope\'");
                    }
                    else if (local_1a0 < 3) {
                      pEVar6 = std::_List_const_iterator<Assimp::LWS::Element>::operator*
                                         (&local_170);
                      bVar1 = std::operator==(pEVar6->tokens,"ObjectMotion");
                      if (!bVar1) {
                        pEVar6 = std::_List_const_iterator<Assimp::LWS::Element>::operator*
                                           (&local_170);
                        bVar1 = std::operator==(pEVar6->tokens,"CameraMotion");
                        if (!bVar1) {
                          pEVar6 = std::_List_const_iterator<Assimp::LWS::Element>::operator*
                                             (&local_170);
                          bVar1 = std::operator==(pEVar6->tokens,"LightMotion");
                          if (!bVar1) goto LAB_00682b5f;
                        }
                      }
                      bVar1 = std::__cxx11::
                              list<Assimp::LWS::NodeDesc,_std::allocator<Assimp::LWS::NodeDesc>_>::
                              empty((list<Assimp::LWS::NodeDesc,_std::allocator<Assimp::LWS::NodeDesc>_>
                                     *)&cur_camera);
                      if (bVar1) {
                        pLVar8 = DefaultLogger::get();
                        Logger::error(pLVar8,
                                      "LWS: Unexpected keyword: \'<Light|Object|Camera>Motion\'");
                      }
                      else {
                        it_1._M_node = (_List_node_base *)
                                       std::__cxx11::
                                       list<Assimp::LWS::Element,_std::allocator<Assimp::LWS::Element>_>
                                       ::end((list<Assimp::LWS::Element,_std::allocator<Assimp::LWS::Element>_>
                                              *)((long)&root.tokens[1].field_2 + 8));
                        std::_List_const_iterator<Assimp::LWS::Element>::_List_const_iterator
                                  (&local_618,(iterator *)&it_1);
                        pvVar10 = std::__cxx11::
                                  list<Assimp::LWS::NodeDesc,_std::allocator<Assimp::LWS::NodeDesc>_>
                                  ::back((list<Assimp::LWS::NodeDesc,_std::allocator<Assimp::LWS::NodeDesc>_>
                                          *)&cur_camera);
                        ReadEnvelope_Old(this,&local_170,&local_618,pvVar10,local_1a0);
                      }
                    }
                    else {
LAB_00682b5f:
                      if (local_1a0 == 2) {
                        pEVar6 = std::_List_const_iterator<Assimp::LWS::Element>::operator*
                                           (&local_170);
                        bVar1 = std::operator==(pEVar6->tokens,"Pre/PostBehavior");
                        if (bVar1) {
                          bVar1 = std::__cxx11::
                                  list<Assimp::LWS::NodeDesc,_std::allocator<Assimp::LWS::NodeDesc>_>
                                  ::empty((list<Assimp::LWS::NodeDesc,_std::allocator<Assimp::LWS::NodeDesc>_>
                                           *)&cur_camera);
                          if (bVar1) {
                            pLVar8 = DefaultLogger::get();
                            Logger::error(pLVar8,"LWS: Unexpected keyword: \'Pre/PostBehavior\'");
                          }
                          else {
                            pvVar10 = std::__cxx11::
                                      list<Assimp::LWS::NodeDesc,_std::allocator<Assimp::LWS::NodeDesc>_>
                                      ::back((list<Assimp::LWS::NodeDesc,_std::allocator<Assimp::LWS::NodeDesc>_>
                                              *)&cur_camera);
                            local_628._M_node =
                                 (_List_node_base *)
                                 std::__cxx11::
                                 list<Assimp::LWO::Envelope,_std::allocator<Assimp::LWO::Envelope>_>
                                 ::begin(&pvVar10->channels);
                            while( true ) {
                              pvVar10 = std::__cxx11::
                                        list<Assimp::LWS::NodeDesc,_std::allocator<Assimp::LWS::NodeDesc>_>
                                        ::back((list<Assimp::LWS::NodeDesc,_std::allocator<Assimp::LWS::NodeDesc>_>
                                                *)&cur_camera);
                              env_1 = (Envelope *)
                                      std::__cxx11::
                                      list<Assimp::LWO::Envelope,_std::allocator<Assimp::LWO::Envelope>_>
                                      ::end(&pvVar10->channels);
                              bVar1 = std::operator!=(&local_628,(_Self *)&env_1);
                              if (!bVar1) break;
                              pEVar9 = std::_List_iterator<Assimp::LWO::Envelope>::operator*
                                                 (&local_628);
                              PVar2 = strtoul10(pcStack_1d8,&stack0xfffffffffffffe28);
                              pEVar9->pre = PVar2;
                              SkipSpaces<char>(&stack0xfffffffffffffe28);
                              PVar2 = strtoul10(pcStack_1d8,&stack0xfffffffffffffe28);
                              pEVar9->post = PVar2;
                              SkipSpaces<char>(&stack0xfffffffffffffe28);
                              std::_List_iterator<Assimp::LWO::Envelope>::operator++(&local_628);
                            }
                          }
                          goto LAB_00683808;
                        }
                      }
                      pEVar6 = std::_List_const_iterator<Assimp::LWS::Element>::operator*
                                         (&local_170);
                      bVar1 = std::operator==(pEVar6->tokens,"ParentItem");
                      if (bVar1) {
                        bVar1 = std::__cxx11::
                                list<Assimp::LWS::NodeDesc,_std::allocator<Assimp::LWS::NodeDesc>_>
                                ::empty((list<Assimp::LWS::NodeDesc,_std::allocator<Assimp::LWS::NodeDesc>_>
                                         *)&cur_camera);
                        if (bVar1) {
                          pLVar8 = DefaultLogger::get();
                          Logger::error(pLVar8,"LWS: Unexpected keyword: \'ParentItem\'");
                        }
                        else {
                          uVar3 = strtoul16(pcStack_1d8,&stack0xfffffffffffffe28);
                          pvVar10 = std::__cxx11::
                                    list<Assimp::LWS::NodeDesc,_std::allocator<Assimp::LWS::NodeDesc>_>
                                    ::back((list<Assimp::LWS::NodeDesc,_std::allocator<Assimp::LWS::NodeDesc>_>
                                            *)&cur_camera);
                          pvVar10->parent = uVar3;
                        }
                      }
                      else {
                        if (local_1a0 < 3) {
                          pEVar6 = std::_List_const_iterator<Assimp::LWS::Element>::operator*
                                             (&local_170);
                          bVar1 = std::operator==(pEVar6->tokens,"ParentObject");
                          if (bVar1) {
                            bVar1 = std::__cxx11::
                                    list<Assimp::LWS::NodeDesc,_std::allocator<Assimp::LWS::NodeDesc>_>
                                    ::empty((list<Assimp::LWS::NodeDesc,_std::allocator<Assimp::LWS::NodeDesc>_>
                                             *)&cur_camera);
                            if (bVar1) {
                              pLVar8 = DefaultLogger::get();
                              Logger::error(pLVar8,"LWS: Unexpected keyword: \'ParentObject\'");
                            }
                            else {
                              uVar3 = strtoul10(pcStack_1d8,&stack0xfffffffffffffe28);
                              pvVar10 = std::__cxx11::
                                        list<Assimp::LWS::NodeDesc,_std::allocator<Assimp::LWS::NodeDesc>_>
                                        ::back((list<Assimp::LWS::NodeDesc,_std::allocator<Assimp::LWS::NodeDesc>_>
                                                *)&cur_camera);
                              pvVar10->parent = uVar3 | 0x10000000;
                            }
                            goto LAB_00683808;
                          }
                        }
                        pEVar6 = std::_List_const_iterator<Assimp::LWS::Element>::operator*
                                           (&local_170);
                        bVar1 = std::operator==(pEVar6->tokens,"AddCamera");
                        if (bVar1) {
                          LWS::NodeDesc::NodeDesc((NodeDesc *)&d_5.parent_resolved);
                          d_5.parent_resolved._0_4_ = 3;
                          if (3 < local_1a0) {
                            strtoul16(pcStack_1d8,&stack0xfffffffffffffe28);
                          }
                          std::__cxx11::
                          list<Assimp::LWS::NodeDesc,_std::allocator<Assimp::LWS::NodeDesc>_>::
                          push_back((list<Assimp::LWS::NodeDesc,_std::allocator<Assimp::LWS::NodeDesc>_>
                                     *)&cur_camera,(value_type *)&d_5.parent_resolved);
                          uStack_15c = uStack_15c + 1;
                          LWS::NodeDesc::~NodeDesc((NodeDesc *)&d_5.parent_resolved);
                        }
                        else {
                          pEVar6 = std::_List_const_iterator<Assimp::LWS::Element>::operator*
                                             (&local_170);
                          bVar1 = std::operator==(pEVar6->tokens,"CameraName");
                          if (bVar1) {
                            bVar1 = std::__cxx11::
                                    list<Assimp::LWS::NodeDesc,_std::allocator<Assimp::LWS::NodeDesc>_>
                                    ::empty((list<Assimp::LWS::NodeDesc,_std::allocator<Assimp::LWS::NodeDesc>_>
                                             *)&cur_camera);
                            if ((bVar1) ||
                               (pvVar10 = std::__cxx11::
                                          list<Assimp::LWS::NodeDesc,_std::allocator<Assimp::LWS::NodeDesc>_>
                                          ::back((list<Assimp::LWS::NodeDesc,_std::allocator<Assimp::LWS::NodeDesc>_>
                                                  *)&cur_camera), pcVar7 = pcStack_1d8,
                               pvVar10->type != CAMERA)) {
                              pLVar8 = DefaultLogger::get();
                              Logger::error(pLVar8,"LWS: Unexpected keyword: \'CameraName\'");
                            }
                            else {
                              pvVar10 = std::__cxx11::
                                        list<Assimp::LWS::NodeDesc,_std::allocator<Assimp::LWS::NodeDesc>_>
                                        ::back((list<Assimp::LWS::NodeDesc,_std::allocator<Assimp::LWS::NodeDesc>_>
                                                *)&cur_camera);
                              pvVar10->name = pcVar7;
                            }
                          }
                          else {
                            pEVar6 = std::_List_const_iterator<Assimp::LWS::Element>::operator*
                                               (&local_170);
                            bVar1 = std::operator==(pEVar6->tokens,"AddLight");
                            if (bVar1) {
                              LWS::NodeDesc::NodeDesc((NodeDesc *)&it_2);
                              it_2._M_node._0_4_ = 2;
                              if (local_1a0 < 4) {
                                d_5.path.field_2._12_4_ = cur_object;
                                cur_object = cur_object + 1;
                              }
                              else {
                                uVar3 = strtoul16(pcStack_1d8,&stack0xfffffffffffffe28);
                                d_5.path.field_2._12_4_ = uVar3 & 0xfffffff;
                              }
                              std::__cxx11::
                              list<Assimp::LWS::NodeDesc,_std::allocator<Assimp::LWS::NodeDesc>_>::
                              push_back((list<Assimp::LWS::NodeDesc,_std::allocator<Assimp::LWS::NodeDesc>_>
                                         *)&cur_camera,(value_type *)&it_2);
                              num_object = num_object + 1;
                              LWS::NodeDesc::~NodeDesc((NodeDesc *)&it_2);
                            }
                            else {
                              pEVar6 = std::_List_const_iterator<Assimp::LWS::Element>::operator*
                                                 (&local_170);
                              bVar1 = std::operator==(pEVar6->tokens,"LightName");
                              if (bVar1) {
                                bVar1 = std::__cxx11::
                                        list<Assimp::LWS::NodeDesc,_std::allocator<Assimp::LWS::NodeDesc>_>
                                        ::empty((list<Assimp::LWS::NodeDesc,_std::allocator<Assimp::LWS::NodeDesc>_>
                                                 *)&cur_camera);
                                if ((bVar1) ||
                                   (pvVar10 = std::__cxx11::
                                              list<Assimp::LWS::NodeDesc,_std::allocator<Assimp::LWS::NodeDesc>_>
                                              ::back((
                                                  list<Assimp::LWS::NodeDesc,_std::allocator<Assimp::LWS::NodeDesc>_>
                                                  *)&cur_camera), pcVar7 = pcStack_1d8,
                                   pvVar10->type != LIGHT)) {
                                  pLVar8 = DefaultLogger::get();
                                  Logger::error(pLVar8,"LWS: Unexpected keyword: \'LightName\'");
                                }
                                else {
                                  pvVar10 = std::__cxx11::
                                            list<Assimp::LWS::NodeDesc,_std::allocator<Assimp::LWS::NodeDesc>_>
                                            ::back((
                                                  list<Assimp::LWS::NodeDesc,_std::allocator<Assimp::LWS::NodeDesc>_>
                                                  *)&cur_camera);
                                  pvVar10->name = pcVar7;
                                }
                              }
                              else {
                                pEVar6 = std::_List_const_iterator<Assimp::LWS::Element>::operator*
                                                   (&local_170);
                                bVar1 = std::operator==(pEVar6->tokens,"LightIntensity");
                                if (!bVar1) {
                                  pEVar6 = std::_List_const_iterator<Assimp::LWS::Element>::
                                           operator*(&local_170);
                                  bVar1 = std::operator==(pEVar6->tokens,"LgtIntensity");
                                  if (!bVar1) {
                                    pEVar6 = std::_List_const_iterator<Assimp::LWS::Element>::
                                             operator*(&local_170);
                                    bVar1 = std::operator==(pEVar6->tokens,"LightType");
                                    if (bVar1) {
                                      bVar1 = std::__cxx11::
                                              list<Assimp::LWS::NodeDesc,_std::allocator<Assimp::LWS::NodeDesc>_>
                                              ::empty((
                                                  list<Assimp::LWS::NodeDesc,_std::allocator<Assimp::LWS::NodeDesc>_>
                                                  *)&cur_camera);
                                      if ((bVar1) ||
                                         (pvVar10 = std::__cxx11::
                                                                                                        
                                                  list<Assimp::LWS::NodeDesc,_std::allocator<Assimp::LWS::NodeDesc>_>
                                                  ::back((
                                                  list<Assimp::LWS::NodeDesc,_std::allocator<Assimp::LWS::NodeDesc>_>
                                                  *)&cur_camera), pvVar10->type != LIGHT)) {
                                        pLVar8 = DefaultLogger::get();
                                        Logger::error(pLVar8,
                                                  "LWS: Unexpected keyword: \'LightType\'");
                                      }
                                      else {
                                        uVar3 = strtoul10(pcStack_1d8,(char **)0x0);
                                        pvVar10 = std::__cxx11::
                                                  list<Assimp::LWS::NodeDesc,_std::allocator<Assimp::LWS::NodeDesc>_>
                                                  ::back((
                                                  list<Assimp::LWS::NodeDesc,_std::allocator<Assimp::LWS::NodeDesc>_>
                                                  *)&cur_camera);
                                        pvVar10->lightType = uVar3;
                                      }
                                    }
                                    else {
                                      pEVar6 = std::_List_const_iterator<Assimp::LWS::Element>::
                                               operator*(&local_170);
                                      bVar1 = std::operator==(pEVar6->tokens,"LightFalloffType");
                                      if (bVar1) {
                                        bVar1 = std::__cxx11::
                                                list<Assimp::LWS::NodeDesc,_std::allocator<Assimp::LWS::NodeDesc>_>
                                                ::empty((
                                                  list<Assimp::LWS::NodeDesc,_std::allocator<Assimp::LWS::NodeDesc>_>
                                                  *)&cur_camera);
                                        if ((bVar1) ||
                                           (pvVar10 = std::__cxx11::
                                                                                                            
                                                  list<Assimp::LWS::NodeDesc,_std::allocator<Assimp::LWS::NodeDesc>_>
                                                  ::back((
                                                  list<Assimp::LWS::NodeDesc,_std::allocator<Assimp::LWS::NodeDesc>_>
                                                  *)&cur_camera), pvVar10->type != LIGHT)) {
                                          pLVar8 = DefaultLogger::get();
                                          Logger::error(pLVar8,
                                                  "LWS: Unexpected keyword: \'LightFalloffType\'");
                                        }
                                        else {
                                          uVar3 = strtoul10(pcStack_1d8,(char **)0x0);
                                          pvVar10 = std::__cxx11::
                                                                                                        
                                                  list<Assimp::LWS::NodeDesc,_std::allocator<Assimp::LWS::NodeDesc>_>
                                                  ::back((
                                                  list<Assimp::LWS::NodeDesc,_std::allocator<Assimp::LWS::NodeDesc>_>
                                                  *)&cur_camera);
                                          pvVar10->lightFalloffType = uVar3;
                                        }
                                      }
                                      else {
                                        pEVar6 = std::_List_const_iterator<Assimp::LWS::Element>::
                                                 operator*(&local_170);
                                        bVar1 = std::operator==(pEVar6->tokens,"LightConeAngle");
                                        if (bVar1) {
                                          bVar1 = std::__cxx11::
                                                  list<Assimp::LWS::NodeDesc,_std::allocator<Assimp::LWS::NodeDesc>_>
                                                  ::empty((
                                                  list<Assimp::LWS::NodeDesc,_std::allocator<Assimp::LWS::NodeDesc>_>
                                                  *)&cur_camera);
                                          if ((bVar1) ||
                                             (pvVar10 = std::__cxx11::
                                                                                                                
                                                  list<Assimp::LWS::NodeDesc,_std::allocator<Assimp::LWS::NodeDesc>_>
                                                  ::back((
                                                  list<Assimp::LWS::NodeDesc,_std::allocator<Assimp::LWS::NodeDesc>_>
                                                  *)&cur_camera), pvVar10->type != LIGHT)) {
                                            pLVar8 = DefaultLogger::get();
                                            Logger::error(pLVar8,
                                                  "LWS: Unexpected keyword: \'LightConeAngle\'");
                                          }
                                          else {
                                            aVar18 = fast_atof(pcStack_1d8);
                                            pvVar10 = std::__cxx11::
                                                                                                            
                                                  list<Assimp::LWS::NodeDesc,_std::allocator<Assimp::LWS::NodeDesc>_>
                                                  ::back((
                                                  list<Assimp::LWS::NodeDesc,_std::allocator<Assimp::LWS::NodeDesc>_>
                                                  *)&cur_camera);
                                            pvVar10->lightConeAngle = aVar18;
                                          }
                                        }
                                        else {
                                          pEVar6 = std::_List_const_iterator<Assimp::LWS::Element>::
                                                   operator*(&local_170);
                                          bVar1 = std::operator==(pEVar6->tokens,"LightEdgeAngle");
                                          if (bVar1) {
                                            bVar1 = std::__cxx11::
                                                                                                        
                                                  list<Assimp::LWS::NodeDesc,_std::allocator<Assimp::LWS::NodeDesc>_>
                                                  ::empty((
                                                  list<Assimp::LWS::NodeDesc,_std::allocator<Assimp::LWS::NodeDesc>_>
                                                  *)&cur_camera);
                                            if ((bVar1) ||
                                               (pvVar10 = std::__cxx11::
                                                                                                                    
                                                  list<Assimp::LWS::NodeDesc,_std::allocator<Assimp::LWS::NodeDesc>_>
                                                  ::back((
                                                  list<Assimp::LWS::NodeDesc,_std::allocator<Assimp::LWS::NodeDesc>_>
                                                  *)&cur_camera), pvVar10->type != LIGHT)) {
                                              pLVar8 = DefaultLogger::get();
                                              Logger::error(pLVar8,
                                                  "LWS: Unexpected keyword: \'LightEdgeAngle\'");
                                            }
                                            else {
                                              aVar18 = fast_atof(pcStack_1d8);
                                              pvVar10 = std::__cxx11::
                                                                                                                
                                                  list<Assimp::LWS::NodeDesc,_std::allocator<Assimp::LWS::NodeDesc>_>
                                                  ::back((
                                                  list<Assimp::LWS::NodeDesc,_std::allocator<Assimp::LWS::NodeDesc>_>
                                                  *)&cur_camera);
                                              pvVar10->lightEdgeAngle = aVar18;
                                            }
                                          }
                                          else {
                                            pEVar6 = std::_List_const_iterator<Assimp::LWS::Element>
                                                     ::operator*(&local_170);
                                            bVar1 = std::operator==(pEVar6->tokens,"LightColor");
                                            if (bVar1) {
                                              bVar1 = std::__cxx11::
                                                                                                            
                                                  list<Assimp::LWS::NodeDesc,_std::allocator<Assimp::LWS::NodeDesc>_>
                                                  ::empty((
                                                  list<Assimp::LWS::NodeDesc,_std::allocator<Assimp::LWS::NodeDesc>_>
                                                  *)&cur_camera);
                                              if ((bVar1) ||
                                                 (pvVar10 = std::__cxx11::
                                                                                                                        
                                                  list<Assimp::LWS::NodeDesc,_std::allocator<Assimp::LWS::NodeDesc>_>
                                                  ::back((
                                                  list<Assimp::LWS::NodeDesc,_std::allocator<Assimp::LWS::NodeDesc>_>
                                                  *)&cur_camera), pcVar7 = pcStack_1d8,
                                                 pvVar10->type != LIGHT)) {
                                                pLVar8 = DefaultLogger::get();
                                                Logger::error(pLVar8,
                                                  "LWS: Unexpected keyword: \'LightColor\'");
                                              }
                                              else {
                                                pvVar10 = std::__cxx11::
                                                                                                                    
                                                  list<Assimp::LWS::NodeDesc,_std::allocator<Assimp::LWS::NodeDesc>_>
                                                  ::back((
                                                  list<Assimp::LWS::NodeDesc,_std::allocator<Assimp::LWS::NodeDesc>_>
                                                  *)&cur_camera);
                                                pcStack_1d8 = fast_atoreal_move<float>
                                                                        (pcVar7,&(pvVar10->
                                                                                 lightColor).r,true)
                                                ;
                                                SkipSpaces<char>(&stack0xfffffffffffffe28);
                                                pcVar7 = pcStack_1d8;
                                                pvVar10 = std::__cxx11::
                                                                                                                    
                                                  list<Assimp::LWS::NodeDesc,_std::allocator<Assimp::LWS::NodeDesc>_>
                                                  ::back((
                                                  list<Assimp::LWS::NodeDesc,_std::allocator<Assimp::LWS::NodeDesc>_>
                                                  *)&cur_camera);
                                                pcStack_1d8 = fast_atoreal_move<float>
                                                                        (pcVar7,&(pvVar10->
                                                                                 lightColor).g,true)
                                                ;
                                                SkipSpaces<char>(&stack0xfffffffffffffe28);
                                                pcVar7 = pcStack_1d8;
                                                pvVar10 = std::__cxx11::
                                                                                                                    
                                                  list<Assimp::LWS::NodeDesc,_std::allocator<Assimp::LWS::NodeDesc>_>
                                                  ::back((
                                                  list<Assimp::LWS::NodeDesc,_std::allocator<Assimp::LWS::NodeDesc>_>
                                                  *)&cur_camera);
                                                pcStack_1d8 = fast_atoreal_move<float>
                                                                        (pcVar7,&(pvVar10->
                                                                                 lightColor).b,true)
                                                ;
                                              }
                                            }
                                            else {
                                              pEVar6 = std::
                                                  _List_const_iterator<Assimp::LWS::Element>::
                                                  operator*(&local_170);
                                              bVar1 = std::operator==(pEVar6->tokens,"PivotPosition"
                                                                     );
                                              if (!bVar1) {
                                                pEVar6 = std::
                                                  _List_const_iterator<Assimp::LWS::Element>::
                                                  operator*(&local_170);
                                                bVar1 = std::operator==(pEVar6->tokens,"PivotPoint")
                                                ;
                                                if (!bVar1) goto LAB_00683808;
                                              }
                                              bVar1 = std::__cxx11::
                                                                                                            
                                                  list<Assimp::LWS::NodeDesc,_std::allocator<Assimp::LWS::NodeDesc>_>
                                                  ::empty((
                                                  list<Assimp::LWS::NodeDesc,_std::allocator<Assimp::LWS::NodeDesc>_>
                                                  *)&cur_camera);
                                              pcVar7 = pcStack_1d8;
                                              if (bVar1) {
                                                pLVar8 = DefaultLogger::get();
                                                Logger::error(pLVar8,
                                                  "LWS: Unexpected keyword: \'PivotPosition\'");
                                              }
                                              else {
                                                pvVar10 = std::__cxx11::
                                                                                                                    
                                                  list<Assimp::LWS::NodeDesc,_std::allocator<Assimp::LWS::NodeDesc>_>
                                                  ::back((
                                                  list<Assimp::LWS::NodeDesc,_std::allocator<Assimp::LWS::NodeDesc>_>
                                                  *)&cur_camera);
                                                pcStack_1d8 = fast_atoreal_move<float>
                                                                        (pcVar7,&(pvVar10->pivotPos)
                                                                                 .x,true);
                                                SkipSpaces<char>(&stack0xfffffffffffffe28);
                                                pcVar7 = pcStack_1d8;
                                                pvVar10 = std::__cxx11::
                                                                                                                    
                                                  list<Assimp::LWS::NodeDesc,_std::allocator<Assimp::LWS::NodeDesc>_>
                                                  ::back((
                                                  list<Assimp::LWS::NodeDesc,_std::allocator<Assimp::LWS::NodeDesc>_>
                                                  *)&cur_camera);
                                                pcStack_1d8 = fast_atoreal_move<float>
                                                                        (pcVar7,&(pvVar10->pivotPos)
                                                                                 .y,true);
                                                SkipSpaces<char>(&stack0xfffffffffffffe28);
                                                pcVar7 = pcStack_1d8;
                                                pvVar10 = std::__cxx11::
                                                                                                                    
                                                  list<Assimp::LWS::NodeDesc,_std::allocator<Assimp::LWS::NodeDesc>_>
                                                  ::back((
                                                  list<Assimp::LWS::NodeDesc,_std::allocator<Assimp::LWS::NodeDesc>_>
                                                  *)&cur_camera);
                                                pcStack_1d8 = fast_atoreal_move<float>
                                                                        (pcVar7,&(pvVar10->pivotPos)
                                                                                 .z,true);
                                                pvVar10 = std::__cxx11::
                                                                                                                    
                                                  list<Assimp::LWS::NodeDesc,_std::allocator<Assimp::LWS::NodeDesc>_>
                                                  ::back((
                                                  list<Assimp::LWS::NodeDesc,_std::allocator<Assimp::LWS::NodeDesc>_>
                                                  *)&cur_camera);
                                                pvVar10->isPivotSet = true;
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                    goto LAB_00683808;
                                  }
                                }
                                bVar1 = std::__cxx11::
                                        list<Assimp::LWS::NodeDesc,_std::allocator<Assimp::LWS::NodeDesc>_>
                                        ::empty((list<Assimp::LWS::NodeDesc,_std::allocator<Assimp::LWS::NodeDesc>_>
                                                 *)&cur_camera);
                                if ((bVar1) ||
                                   (pvVar10 = std::__cxx11::
                                              list<Assimp::LWS::NodeDesc,_std::allocator<Assimp::LWS::NodeDesc>_>
                                              ::back((
                                                  list<Assimp::LWS::NodeDesc,_std::allocator<Assimp::LWS::NodeDesc>_>
                                                  *)&cur_camera), pcVar7 = pcStack_1d8,
                                   pvVar10->type != LIGHT)) {
                                  pLVar8 = DefaultLogger::get();
                                  Logger::error(pLVar8,"LWS: Unexpected keyword: \'LightIntensity\'"
                                               );
                                }
                                else {
                                  pvVar10 = std::__cxx11::
                                            list<Assimp::LWS::NodeDesc,_std::allocator<Assimp::LWS::NodeDesc>_>
                                            ::back((
                                                  list<Assimp::LWS::NodeDesc,_std::allocator<Assimp::LWS::NodeDesc>_>
                                                  *)&cur_camera);
                                  fast_atoreal_move<float>(pcVar7,&pvVar10->lightIntensity,true);
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
LAB_00683808:
    std::_List_const_iterator<Assimp::LWS::Element>::operator++(&local_170);
  } while( true );
}

Assistant:

void LWSImporter::InternReadFile( const std::string& pFile, aiScene* pScene,
    IOSystem* pIOHandler)
{
    io = pIOHandler;
    std::unique_ptr<IOStream> file( pIOHandler->Open( pFile, "rb"));

    // Check whether we can read from the file
    if( file.get() == NULL) {
        throw DeadlyImportError( "Failed to open LWS file " + pFile + ".");
    }

    // Allocate storage and copy the contents of the file to a memory buffer
    std::vector< char > mBuffer;
    TextFileToBuffer(file.get(),mBuffer);

    // Parse the file structure
    LWS::Element root; const char* dummy = &mBuffer[0];
    root.Parse(dummy);

    // Construct a Batchimporter to read more files recursively
    BatchLoader batch(pIOHandler);
//  batch.SetBasePath(pFile);

    // Construct an array to receive the flat output graph
    std::list<LWS::NodeDesc> nodes;

    unsigned int cur_light = 0, cur_camera = 0, cur_object = 0;
    unsigned int num_light = 0, num_camera = 0, num_object = 0;

    // check magic identifier, 'LWSC'
    bool motion_file = false;
    std::list< LWS::Element >::const_iterator it = root.children.begin();

    if ((*it).tokens[0] == "LWMO")
        motion_file = true;

    if ((*it).tokens[0] != "LWSC" && !motion_file)
        throw DeadlyImportError("LWS: Not a LightWave scene, magic tag LWSC not found");

    // get file format version and print to log
    ++it;
    unsigned int version = strtoul10((*it).tokens[0].c_str());
    ASSIMP_LOG_INFO("LWS file format version is " + (*it).tokens[0]);
    first = 0.;
    last  = 60.;
    fps   = 25.; /* seems to be a good default frame rate */

    // Now read all elements in a very straghtforward manner
    for (; it != root.children.end(); ++it) {
        const char* c = (*it).tokens[1].c_str();

        // 'FirstFrame': begin of animation slice
        if ((*it).tokens[0] == "FirstFrame") {
            if (150392. != first           /* see SetupProperties() */)
                first = strtoul10(c,&c)-1.; /* we're zero-based */
        }

        // 'LastFrame': end of animation slice
        else if ((*it).tokens[0] == "LastFrame") {
            if (150392. != last      /* see SetupProperties() */)
                last = strtoul10(c,&c)-1.; /* we're zero-based */
        }

        // 'FramesPerSecond': frames per second
        else if ((*it).tokens[0] == "FramesPerSecond") {
            fps = strtoul10(c,&c);
        }

        // 'LoadObjectLayer': load a layer of a specific LWO file
        else if ((*it).tokens[0] == "LoadObjectLayer") {

            // get layer index
            const int layer = strtoul10(c,&c);

            // setup the layer to be loaded
            BatchLoader::PropertyMap props;
            SetGenericProperty(props.ints,AI_CONFIG_IMPORT_LWO_ONE_LAYER_ONLY,layer);

            // add node to list
            LWS::NodeDesc d;
            d.type = LWS::NodeDesc::OBJECT;
            if (version >= 4) { // handle LWSC 4 explicit ID
                SkipSpaces(&c);
                d.number = strtoul16(c,&c) & AI_LWS_MASK;
            }
            else d.number = cur_object++;

            // and add the file to the import list
            SkipSpaces(&c);
            std::string path = FindLWOFile( c );
            d.path = path;
            d.id = batch.AddLoadRequest(path,0,&props);

            nodes.push_back(d);
            num_object++;
        }
        // 'LoadObject': load a LWO file into the scenegraph
        else if ((*it).tokens[0] == "LoadObject") {

            // add node to list
            LWS::NodeDesc d;
            d.type = LWS::NodeDesc::OBJECT;

            if (version >= 4) { // handle LWSC 4 explicit ID
                d.number = strtoul16(c,&c) & AI_LWS_MASK;
                SkipSpaces(&c);
            }
            else d.number = cur_object++;
            std::string path = FindLWOFile( c );
            d.id = batch.AddLoadRequest(path,0,NULL);

            d.path = path;
            nodes.push_back(d);
            num_object++;
        }
        // 'AddNullObject': add a dummy node to the hierarchy
        else if ((*it).tokens[0] == "AddNullObject") {

            // add node to list
            LWS::NodeDesc d;
            d.type = LWS::NodeDesc::OBJECT;
            if (version >= 4) { // handle LWSC 4 explicit ID
                d.number = strtoul16(c,&c) & AI_LWS_MASK;
                SkipSpaces(&c);
            }
            else d.number = cur_object++;
            d.name = c;
            nodes.push_back(d);

            num_object++;
        }
        // 'NumChannels': Number of envelope channels assigned to last layer
        else if ((*it).tokens[0] == "NumChannels") {
            // ignore for now
        }
        // 'Channel': preceedes any envelope description
        else if ((*it).tokens[0] == "Channel") {
            if (nodes.empty()) {
                if (motion_file) {

                    // LightWave motion file. Add dummy node
                    LWS::NodeDesc d;
                    d.type = LWS::NodeDesc::OBJECT;
                    d.name = c;
                    d.number = cur_object++;
                    nodes.push_back(d);
                }
                ASSIMP_LOG_ERROR("LWS: Unexpected keyword: \'Channel\'");
            }

            // important: index of channel
            nodes.back().channels.push_back(LWO::Envelope());
            LWO::Envelope& env = nodes.back().channels.back();

            env.index = strtoul10(c);

            // currently we can just interpret the standard channels 0...9
            // (hack) assume that index-i yields the binary channel type from LWO
            env.type = (LWO::EnvelopeType)(env.index+1);

        }
        // 'Envelope': a single animation channel
        else if ((*it).tokens[0] == "Envelope") {
            if (nodes.empty() || nodes.back().channels.empty())
                ASSIMP_LOG_ERROR("LWS: Unexpected keyword: \'Envelope\'");
            else {
                ReadEnvelope((*it),nodes.back().channels.back());
            }
        }
        // 'ObjectMotion': animation information for older lightwave formats
        else if (version < 3  && ((*it).tokens[0] == "ObjectMotion" ||
            (*it).tokens[0] == "CameraMotion" ||
            (*it).tokens[0] == "LightMotion")) {

            if (nodes.empty())
                ASSIMP_LOG_ERROR("LWS: Unexpected keyword: \'<Light|Object|Camera>Motion\'");
            else {
                ReadEnvelope_Old(it,root.children.end(),nodes.back(),version);
            }
        }
        // 'Pre/PostBehavior': pre/post animation behaviour for LWSC 2
        else if (version == 2 && (*it).tokens[0] == "Pre/PostBehavior") {
            if (nodes.empty())
                ASSIMP_LOG_ERROR("LWS: Unexpected keyword: \'Pre/PostBehavior'");
            else {
                for (std::list<LWO::Envelope>::iterator it = nodes.back().channels.begin(); it != nodes.back().channels.end(); ++it) {
                    // two ints per envelope
                    LWO::Envelope& env = *it;
                    env.pre  = (LWO::PrePostBehaviour) strtoul10(c,&c); SkipSpaces(&c);
                    env.post = (LWO::PrePostBehaviour) strtoul10(c,&c); SkipSpaces(&c);
                }
            }
        }
        // 'ParentItem': specifies the parent of the current element
        else if ((*it).tokens[0] == "ParentItem") {
            if (nodes.empty())
                ASSIMP_LOG_ERROR("LWS: Unexpected keyword: \'ParentItem\'");

            else nodes.back().parent = strtoul16(c,&c);
        }
        // 'ParentObject': deprecated one for older formats
        else if (version < 3 && (*it).tokens[0] == "ParentObject") {
            if (nodes.empty())
                ASSIMP_LOG_ERROR("LWS: Unexpected keyword: \'ParentObject\'");

            else {
                nodes.back().parent = strtoul10(c,&c) | (1u << 28u);
            }
        }
        // 'AddCamera': add a camera to the scenegraph
        else if ((*it).tokens[0] == "AddCamera") {

            // add node to list
            LWS::NodeDesc d;
            d.type = LWS::NodeDesc::CAMERA;

            if (version >= 4) { // handle LWSC 4 explicit ID
                d.number = strtoul16(c,&c) & AI_LWS_MASK;
            }
            else d.number = cur_camera++;
            nodes.push_back(d);

            num_camera++;
        }
        // 'CameraName': set name of currently active camera
        else if ((*it).tokens[0] == "CameraName") {
            if (nodes.empty() || nodes.back().type != LWS::NodeDesc::CAMERA)
                ASSIMP_LOG_ERROR("LWS: Unexpected keyword: \'CameraName\'");

            else nodes.back().name = c;
        }
        // 'AddLight': add a light to the scenegraph
        else if ((*it).tokens[0] == "AddLight") {

            // add node to list
            LWS::NodeDesc d;
            d.type = LWS::NodeDesc::LIGHT;

            if (version >= 4) { // handle LWSC 4 explicit ID
                d.number = strtoul16(c,&c) & AI_LWS_MASK;
            }
            else d.number = cur_light++;
            nodes.push_back(d);

            num_light++;
        }
        // 'LightName': set name of currently active light
        else if ((*it).tokens[0] == "LightName") {
            if (nodes.empty() || nodes.back().type != LWS::NodeDesc::LIGHT)
                ASSIMP_LOG_ERROR("LWS: Unexpected keyword: \'LightName\'");

            else nodes.back().name = c;
        }
        // 'LightIntensity': set intensity of currently active light
        else if ((*it).tokens[0] == "LightIntensity" || (*it).tokens[0] == "LgtIntensity" ) {
            if (nodes.empty() || nodes.back().type != LWS::NodeDesc::LIGHT)
                ASSIMP_LOG_ERROR("LWS: Unexpected keyword: \'LightIntensity\'");

            else fast_atoreal_move<float>(c, nodes.back().lightIntensity );

        }
        // 'LightType': set type of currently active light
        else if ((*it).tokens[0] == "LightType") {
            if (nodes.empty() || nodes.back().type != LWS::NodeDesc::LIGHT)
                ASSIMP_LOG_ERROR("LWS: Unexpected keyword: \'LightType\'");

            else nodes.back().lightType = strtoul10(c);

        }
        // 'LightFalloffType': set falloff type of currently active light
        else if ((*it).tokens[0] == "LightFalloffType") {
            if (nodes.empty() || nodes.back().type != LWS::NodeDesc::LIGHT)
                ASSIMP_LOG_ERROR("LWS: Unexpected keyword: \'LightFalloffType\'");

            else nodes.back().lightFalloffType = strtoul10(c);

        }
        // 'LightConeAngle': set cone angle of currently active light
        else if ((*it).tokens[0] == "LightConeAngle") {
            if (nodes.empty() || nodes.back().type != LWS::NodeDesc::LIGHT)
                ASSIMP_LOG_ERROR("LWS: Unexpected keyword: \'LightConeAngle\'");

            else nodes.back().lightConeAngle = fast_atof(c);

        }
        // 'LightEdgeAngle': set area where we're smoothing from min to max intensity
        else if ((*it).tokens[0] == "LightEdgeAngle") {
            if (nodes.empty() || nodes.back().type != LWS::NodeDesc::LIGHT)
                ASSIMP_LOG_ERROR("LWS: Unexpected keyword: \'LightEdgeAngle\'");

            else nodes.back().lightEdgeAngle = fast_atof(c);

        }
        // 'LightColor': set color of currently active light
        else if ((*it).tokens[0] == "LightColor") {
            if (nodes.empty() || nodes.back().type != LWS::NodeDesc::LIGHT)
                ASSIMP_LOG_ERROR("LWS: Unexpected keyword: \'LightColor\'");

            else {
                c = fast_atoreal_move<float>(c, (float&) nodes.back().lightColor.r );
                SkipSpaces(&c);
                c = fast_atoreal_move<float>(c, (float&) nodes.back().lightColor.g );
                SkipSpaces(&c);
                c = fast_atoreal_move<float>(c, (float&) nodes.back().lightColor.b );
            }
        }

        // 'PivotPosition': position of local transformation origin
        else if ((*it).tokens[0] == "PivotPosition" || (*it).tokens[0] == "PivotPoint") {
            if (nodes.empty())
                ASSIMP_LOG_ERROR("LWS: Unexpected keyword: \'PivotPosition\'");
            else {
                c = fast_atoreal_move<float>(c, (float&) nodes.back().pivotPos.x );
                SkipSpaces(&c);
                c = fast_atoreal_move<float>(c, (float&) nodes.back().pivotPos.y );
                SkipSpaces(&c);
                c = fast_atoreal_move<float>(c, (float&) nodes.back().pivotPos.z );
                // Mark pivotPos as set
                nodes.back().isPivotSet = true;
            }
        }
    }

    // resolve parenting
    for (std::list<LWS::NodeDesc>::iterator it = nodes.begin(); it != nodes.end(); ++it) {

        // check whether there is another node which calls us a parent
        for (std::list<LWS::NodeDesc>::iterator dit = nodes.begin(); dit != nodes.end(); ++dit) {
            if (dit != it && *it == (*dit).parent) {
                if ((*dit).parent_resolved) {
                    // fixme: it's still possible to produce an overflow due to cross references ..
                    ASSIMP_LOG_ERROR("LWS: Found cross reference in scene-graph");
                    continue;
                }

                (*it).children.push_back(&*dit);
                (*dit).parent_resolved = &*it;
            }
        }
    }

    // find out how many nodes have no parent yet
    unsigned int no_parent = 0;
    for (std::list<LWS::NodeDesc>::iterator it = nodes.begin(); it != nodes.end(); ++it) {
        if (!(*it).parent_resolved)
            ++ no_parent;
    }
    if (!no_parent)
        throw DeadlyImportError("LWS: Unable to find scene root node");


    // Load all subsequent files
    batch.LoadAll();

    // and build the final output graph by attaching the loaded external
    // files to ourselves. first build a master graph
    aiScene* master = new aiScene();
    aiNode* nd = master->mRootNode = new aiNode();

    // allocate storage for cameras&lights
    if (num_camera) {
        master->mCameras = new aiCamera*[master->mNumCameras = num_camera];
    }
    aiCamera** cams = master->mCameras;
    if (num_light) {
        master->mLights = new aiLight*[master->mNumLights = num_light];
    }
    aiLight** lights = master->mLights;

    std::vector<AttachmentInfo> attach;
    std::vector<aiNodeAnim*> anims;

    nd->mName.Set("<LWSRoot>");
    nd->mChildren = new aiNode*[no_parent];
    for (std::list<LWS::NodeDesc>::iterator it = nodes.begin(); it != nodes.end(); ++it) {
        if (!(*it).parent_resolved) {
            aiNode* ro = nd->mChildren[ nd->mNumChildren++ ] = new aiNode();
            ro->mParent = nd;

            // ... and build the scene graph. If we encounter object nodes,
            // add then to our attachment table.
            BuildGraph(ro,*it, attach, batch, cams, lights, anims);
        }
    }

    // create a master animation channel for us
    if (anims.size()) {
        master->mAnimations = new aiAnimation*[master->mNumAnimations = 1];
        aiAnimation* anim = master->mAnimations[0] = new aiAnimation();
        anim->mName.Set("LWSMasterAnim");

        // LWS uses seconds as time units, but we convert to frames
        anim->mTicksPerSecond = fps;
        anim->mDuration = last-(first-1); /* fixme ... zero or one-based?*/

        anim->mChannels = new aiNodeAnim*[anim->mNumChannels = static_cast<unsigned int>(anims.size())];
        std::copy(anims.begin(),anims.end(),anim->mChannels);
    }

    // convert the master scene to RH
    MakeLeftHandedProcess monster_cheat;
    monster_cheat.Execute(master);

    // .. ccw
    FlipWindingOrderProcess flipper;
    flipper.Execute(master);

    // OK ... finally build the output graph
    SceneCombiner::MergeScenes(&pScene,master,attach,
        AI_INT_MERGE_SCENE_GEN_UNIQUE_NAMES    | (!configSpeedFlag ? (
        AI_INT_MERGE_SCENE_GEN_UNIQUE_NAMES_IF_NECESSARY | AI_INT_MERGE_SCENE_GEN_UNIQUE_MATNAMES) : 0));

    // Check flags
    if (!pScene->mNumMeshes || !pScene->mNumMaterials) {
        pScene->mFlags |= AI_SCENE_FLAGS_INCOMPLETE;

        if (pScene->mNumAnimations && !noSkeletonMesh) {
            // construct skeleton mesh
            SkeletonMeshBuilder builder(pScene);
        }
    }

}